

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oaa.cc
# Opt level: O1

void finish_example_scores<false>(vw *all,oaa *o,example *ec)

{
  v_array<char> *pvVar1;
  float *pfVar2;
  int iVar3;
  float *pfVar4;
  namedlabels *pnVar5;
  pointer psVar6;
  int *piVar7;
  _func_void_int_string_v_array<char> *p_Var8;
  v_array<char> vVar9;
  ostream *poVar10;
  size_t sVar11;
  uint uVar12;
  char *pcVar13;
  ulong uVar14;
  undefined8 uVar15;
  uint32_t pred;
  ulong uVar16;
  int *piVar17;
  float fVar18;
  char temp_str [10];
  ostringstream outputStringStream;
  undefined8 in_stack_fffffffffffffde8;
  char *local_1f8;
  long local_1f0;
  char local_1e8 [16];
  undefined1 *local_1d8;
  undefined1 local_1c8 [22];
  char local_1b2 [10];
  undefined1 local_1a8 [376];
  
  pred = 1;
  if (1 < o->k) {
    pfVar4 = (ec->pred).scalars._begin;
    uVar16 = 0;
    uVar14 = 1;
    uVar12 = 2;
    do {
      fVar18 = pfVar4[uVar14];
      pfVar2 = pfVar4 + uVar16;
      if (*pfVar2 <= fVar18 && fVar18 != *pfVar2) {
        uVar16 = (ulong)(uVar12 - 1);
      }
      uVar14 = (ulong)uVar12;
      uVar12 = uVar12 + 1;
    } while (uVar14 < o->k);
    pred = (int)uVar16 + 1;
  }
  fVar18 = 0.0;
  if ((ec->l).multi.label != pred) {
    fVar18 = ec->weight;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  if (o->k != 0) {
    uVar14 = 0;
    do {
      uVar12 = (uint)uVar14;
      if (uVar12 != 0) {
        local_1f8 = (char *)CONCAT71(local_1f8._1_7_,0x20);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(char *)&local_1f8,1);
      }
      pnVar5 = all->sd->ldict;
      if (pnVar5 == (namedlabels *)0x0) {
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      }
      else {
        pcVar13 = (char *)0x0;
        uVar15 = 0;
        if (uVar12 < pnVar5->K) {
          psVar6 = (pnVar5->id2name).super__Vector_base<substring,_std::allocator<substring>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar15 = psVar6[uVar14].begin;
          pcVar13 = psVar6[uVar14].end;
        }
        local_1f8 = local_1e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,uVar15,pcVar13);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_1f8,local_1f0)
        ;
        if (local_1f8 != local_1e8) {
          operator_delete(local_1f8);
        }
      }
      sprintf(local_1b2,"%f",SUB84((double)(ec->pred).scalars._begin[uVar14],0));
      local_1f8 = (char *)CONCAT71(local_1f8._1_7_,0x3a);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,(char *)&local_1f8,1);
      sVar11 = strlen(local_1b2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_1b2,sVar11);
      uVar14 = (ulong)(uVar12 + 1);
    } while (uVar14 < o->k);
  }
  piVar17 = (all->final_prediction_sink)._begin;
  piVar7 = (all->final_prediction_sink)._end;
  if (piVar17 != piVar7) {
    pvVar1 = &ec->tag;
    do {
      iVar3 = *piVar17;
      p_Var8 = all->print_text;
      std::__cxx11::stringbuf::str();
      vVar9._end = (char *)ec;
      vVar9._begin = (char *)in_stack_fffffffffffffde8;
      vVar9.end_array = (char *)all;
      vVar9.erase_count._0_4_ = fVar18;
      vVar9.erase_count._4_4_ = pred;
      (*p_Var8)(iVar3,(string)*pvVar1,vVar9);
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8);
      }
      piVar17 = piVar17 + 1;
    } while (piVar17 != piVar7);
  }
  shared_data::update(all->sd,ec->test_only,(ec->l).multi.label != 0xffffffff,fVar18,ec->weight,
                      ec->num_features);
  MULTICLASS::print_update_with_score(all,ec,pred);
  VW::finish_example(all,ec);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return;
}

Assistant:

void finish_example_scores(vw& all, oaa& o, example& ec)
{
  // === Compute multiclass_log_loss
  // TODO:
  // What to do if the correct label is unknown, i.e. (uint32_t)-1?
  //   Suggestion: increase all.sd->weighted_unlabeled_examples???,
  //               but not sd.example_number, so the average loss is not influenced.
  // What to do if the correct_class_prob==0?
  //   Suggestion: have some maximal multiclass_log_loss limit, e.g. 999.
  float multiclass_log_loss = 999;  // -log(0) = plus infinity
  float correct_class_prob = 0;
  if (probabilities)
  {
    if (ec.l.multi.label <= o.k)  // prevent segmentation fault if labeĺ==(uint32_t)-1
      correct_class_prob = ec.pred.scalars[ec.l.multi.label - 1];
    if (correct_class_prob > 0)
      multiclass_log_loss = -log(correct_class_prob) * ec.weight;
    if (ec.test_only)
      all.sd->holdout_multiclass_log_loss += multiclass_log_loss;
    else
      all.sd->multiclass_log_loss += multiclass_log_loss;
  }
  // === Compute `prediction` and zero_one_loss
  // We have already computed `prediction` in predict_or_learn,
  // but we cannot store it in ec.pred union because we store ec.pred.probs there.
  uint32_t prediction = 0;
  for (uint32_t i = 1; i < o.k; i++)
    if (ec.pred.scalars[i] > ec.pred.scalars[prediction])
      prediction = i;
  prediction++;  // prediction is 1-based index (not 0-based)
  float zero_one_loss = 0;
  if (ec.l.multi.label != prediction)
    zero_one_loss = ec.weight;

  // === Print probabilities for all classes
  char temp_str[10];
  ostringstream outputStringStream;
  for (uint32_t i = 0; i < o.k; i++)
  {
    if (i > 0)
      outputStringStream << ' ';
    if (all.sd->ldict)
    {
      substring ss = all.sd->ldict->get(i + 1);
      outputStringStream << string(ss.begin, ss.end - ss.begin);
    }
    else
      outputStringStream << i + 1;
    sprintf(temp_str, "%f", ec.pred.scalars[i]);  // 0.123 -> 0.123000
    outputStringStream << ':' << temp_str;
  }
  for (int sink : all.final_prediction_sink) all.print_text(sink, outputStringStream.str(), ec.tag);

  // === Report updates using zero-one loss
  all.sd->update(ec.test_only, ec.l.multi.label != (uint32_t)-1, zero_one_loss, ec.weight, ec.num_features);
  // Alternatively, we could report multiclass_log_loss.
  // all.sd->update(ec.test_only, multiclass_log_loss, ec.weight, ec.num_features);
  // Even better would be to report both losses, but this would mean to increase
  // the number of columns and this would not fit narrow screens.
  // So let's report (average) multiclass_log_loss only in the final resume.

  // === Print progress report
  if (probabilities)
    MULTICLASS::print_update_with_probability(all, ec, prediction);
  else
    MULTICLASS::print_update_with_score(all, ec, prediction);
  VW::finish_example(all, ec);
}